

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O3

void __thiscall
Assimp::CSMImporter::InternReadFile
          (CSMImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  byte *pbVar1;
  undefined8 *puVar2;
  uint uVar3;
  _Head_base<0UL,_aiAnimation_*,_false> _Var4;
  pointer __src;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  aiAnimation *paVar10;
  aiVectorKey *paVar11;
  aiVectorKey *__dest;
  Logger *this_00;
  aiNodeAnim *paVar12;
  aiNodeAnim **__dest_00;
  aiNode *paVar13;
  aiNode **ppaVar14;
  aiNode *this_01;
  aiAnimation **ppaVar15;
  runtime_error *prVar16;
  long *plVar17;
  ulong uVar18;
  long lVar19;
  aiNodeAnim *paVar20;
  byte bVar21;
  uint i;
  ulong uVar22;
  _Head_base<0UL,_aiAnimation_*,_false> _Var23;
  _Alloc_hider __s2;
  byte *pbVar24;
  ulong uVar25;
  aiScene *pScene_00;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> anim;
  float d;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims_temp;
  vector<char,_std::allocator<char>_> mBuffer2;
  _Head_base<0UL,_aiAnimation_*,_false> local_128;
  int local_11c;
  ulong local_118;
  undefined1 local_110 [24];
  pointer pFStack_f8;
  pointer local_e8;
  pointer local_e0;
  pointer local_d0;
  int local_bc;
  aiNodeAnim *local_b8;
  ulong local_b0;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  IOStream *local_60;
  aiScene *local_58;
  size_t local_50;
  ulong local_48;
  double local_40;
  CSMImporter *local_38;
  IOStream *pIVar9;
  
  paVar12 = (aiNodeAnim *)(local_110 + 0x10);
  local_110._0_8_ = paVar12;
  local_58 = pScene;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"rb","");
  iVar6 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_110._0_8_);
  pIVar9 = (IOStream *)CONCAT44(extraout_var,iVar6);
  if ((aiNodeAnim *)local_110._0_8_ != paVar12) {
    operator_delete((void *)local_110._0_8_,(ulong)((long)(float *)local_110._16_8_ + 1));
  }
  if (pIVar9 == (IOStream *)0x0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_88,"Failed to open CSM file ",pFile);
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_110._0_8_ = *plVar17;
    paVar20 = (aiNodeAnim *)(plVar17 + 2);
    if ((aiNodeAnim *)local_110._0_8_ == paVar20) {
      local_110._16_8_ = *(undefined8 *)&paVar20->mNodeName;
      pFStack_f8 = (pointer)plVar17[3];
      local_110._0_8_ = paVar12;
    }
    else {
      local_110._16_8_ = *(undefined8 *)&paVar20->mNodeName;
    }
    local_110._8_8_ = plVar17[1];
    *plVar17 = (long)paVar20;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    std::runtime_error::runtime_error(prVar16,(string *)local_110);
    *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  BaseImporter::TextFileToBuffer
            (pIVar9,(vector<char,_std::allocator<char>_> *)&local_88,FORBID_EMPTY);
  __s2._M_p = local_88._M_dataplus._M_p;
  paVar10 = (aiAnimation *)operator_new(0x448);
  (paVar10->mName).length = 0;
  (paVar10->mName).data[0] = '\0';
  memset((paVar10->mName).data + 1,0x1b,0x3ff);
  paVar10->mDuration = -1.0;
  paVar10->mTicksPerSecond = 0.0;
  paVar10->mNumChannels = 0;
  paVar10->mChannels = (aiNodeAnim **)0x0;
  paVar10->mNumMeshChannels = 0;
  paVar10->mMeshChannels = (aiMeshAnim **)0x0;
  paVar10->mNumMorphMeshChannels = 0;
  paVar10->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  local_b0 = 0;
  local_60 = pIVar9;
  local_128._M_head_impl = paVar10;
  iVar6 = 0xffffff;
LAB_0043a440:
  do {
    pbVar24 = (byte *)__s2._M_p;
    pScene_00 = local_58;
    bVar5 = *pbVar24;
    if (bVar5 < 0x20) {
      if (bVar5 != 9) {
        if (bVar5 == 0) {
          (local_128._M_head_impl)->mDuration =
               (double)(int)(iVar6 - ((int)(uint)local_b0 >> 0x1f & (uint)local_b0));
          paVar13 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(paVar13);
          _Var23._M_head_impl = local_128._M_head_impl;
          pScene_00->mRootNode = paVar13;
          (paVar13->mName).length = 0xe;
          builtin_strncpy((paVar13->mName).data,"$CSM_DummyRoot",0xf);
          uVar8 = (local_128._M_head_impl)->mNumChannels;
          paVar13->mNumChildren = uVar8;
          ppaVar14 = (aiNode **)operator_new__((ulong)uVar8 << 3);
          paVar13->mChildren = ppaVar14;
          if ((_Var23._M_head_impl)->mNumChannels != 0) {
            uVar25 = 0;
            do {
              paVar12 = (_Var23._M_head_impl)->mChannels[uVar25];
              this_01 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(this_01);
              _Var23._M_head_impl = local_128._M_head_impl;
              pScene_00->mRootNode->mChildren[uVar25] = this_01;
              paVar13 = (aiNode *)(local_128._M_head_impl)->mChannels[uVar25];
              if (this_01 != paVar13) {
                uVar8 = (paVar13->mName).length;
                (this_01->mName).length = uVar8;
                memcpy((this_01->mName).data,(paVar13->mName).data,(ulong)uVar8);
                (this_01->mName).data[uVar8] = '\0';
                pScene_00 = local_58;
              }
              this_01->mParent = pScene_00->mRootNode;
              paVar11 = paVar12->mPositionKeys;
              (this_01->mTransformation).a1 = 1.0;
              (this_01->mTransformation).a2 = 0.0;
              (this_01->mTransformation).a3 = 0.0;
              (this_01->mTransformation).a4 = 0.0;
              (this_01->mTransformation).b1 = 0.0;
              (this_01->mTransformation).b2 = 1.0;
              (this_01->mTransformation).b3 = 0.0;
              (this_01->mTransformation).b4 = 0.0;
              (this_01->mTransformation).c1 = 0.0;
              (this_01->mTransformation).c2 = 0.0;
              (this_01->mTransformation).c3 = 1.0;
              (this_01->mTransformation).c4 = 0.0;
              (this_01->mTransformation).d1 = 0.0;
              (this_01->mTransformation).d2 = 0.0;
              (this_01->mTransformation).d3 = 0.0;
              (this_01->mTransformation).d4 = 1.0;
              (this_01->mTransformation).a4 = (paVar11->mValue).x;
              (this_01->mTransformation).b4 = (paVar11->mValue).y;
              (this_01->mTransformation).c4 = (paVar11->mValue).z;
              uVar25 = uVar25 + 1;
            } while (uVar25 < (_Var23._M_head_impl)->mNumChannels);
          }
          pScene_00->mNumAnimations = 1;
          ppaVar15 = (aiAnimation **)operator_new__(8);
          pIVar9 = local_60;
          _Var4._M_head_impl = local_128._M_head_impl;
          pScene_00->mAnimations = ppaVar15;
          ((_Var23._M_head_impl)->mName).length = 0xf;
          builtin_strncpy(((_Var23._M_head_impl)->mName).data,"$CSM_MasterAnim",0x10);
          local_128._M_head_impl = (aiAnimation *)0x0;
          *pScene_00->mAnimations = _Var4._M_head_impl;
          *(byte *)&pScene_00->mFlags = (byte)pScene_00->mFlags | 1;
          if (local_38->noSkeletonMesh == false) {
            SkeletonMeshBuilder::SkeletonMeshBuilder
                      ((SkeletonMeshBuilder *)local_110,pScene_00,pScene_00->mRootNode,true);
            if (local_e0 != (pointer)0x0) {
              operator_delete(local_e0,(long)local_d0 - (long)local_e0);
            }
            if (pFStack_f8 != (pointer)0x0) {
              operator_delete(pFStack_f8,(long)local_e8 - (long)pFStack_f8);
            }
            if ((aiNodeAnim *)local_110._0_8_ != (aiNodeAnim *)0x0) {
              operator_delete((void *)local_110._0_8_,local_110._16_8_ - local_110._0_8_);
            }
          }
          std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr
                    ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&local_128);
          if ((byte *)local_88._M_dataplus._M_p != (byte *)0x0) {
            operator_delete(local_88._M_dataplus._M_p,
                            local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p
                           );
          }
          (*pIVar9->_vptr_IOStream[1])(pIVar9);
          return;
        }
        goto LAB_0043a8aa;
      }
LAB_0043a458:
      __s2._M_p = (pointer)(pbVar24 + 1);
      goto LAB_0043a440;
    }
    if (bVar5 == 0x20) goto LAB_0043a458;
    if (bVar5 == 0x24) {
      __s2._M_p = (pointer)(pbVar24 + 1);
      iVar7 = strncasecmp("firstframe",__s2._M_p,10);
      if (((iVar7 == 0) && ((ulong)pbVar24[0xb] < 0x21)) &&
         ((0x100003601U >> ((ulong)pbVar24[0xb] & 0x3f) & 1) != 0)) {
        for (pbVar24 = pbVar24 + 0xc; (bVar5 = *pbVar24, bVar5 == 0x20 || (bVar5 == 9));
            pbVar24 = pbVar24 + 1) {
        }
        __s2._M_p = (pointer)(pbVar24 + ((bVar5 - 0x2b & 0xfd) == 0));
        bVar21 = *__s2._M_p;
        uVar8 = 0;
        if (0xf5 < (byte)(bVar21 - 0x3a)) {
          uVar8 = 0;
          do {
            uVar8 = (uint)(byte)(bVar21 - 0x30) + uVar8 * 10;
            bVar21 = ((byte *)__s2._M_p)[1];
            __s2._M_p = __s2._M_p + 1;
          } while (0xf5 < (byte)(bVar21 - 0x3a));
        }
        uVar3 = -uVar8;
        if (bVar5 != 0x2d) {
          uVar3 = uVar8;
        }
        local_b0 = (ulong)uVar3;
      }
      else {
        iVar7 = strncasecmp("lastframe",__s2._M_p,9);
        if (((iVar7 == 0) && ((ulong)pbVar24[10] < 0x21)) &&
           ((0x100003601U >> ((ulong)pbVar24[10] & 0x3f) & 1) != 0)) {
          for (pbVar24 = pbVar24 + 0xb; (bVar5 = *pbVar24, bVar5 == 0x20 || (bVar5 == 9));
              pbVar24 = pbVar24 + 1) {
          }
          __s2._M_p = (pointer)(pbVar24 + ((bVar5 - 0x2b & 0xfd) == 0));
          bVar21 = *__s2._M_p;
          iVar7 = 0;
          if (0xf5 < (byte)(bVar21 - 0x3a)) {
            iVar7 = 0;
            do {
              iVar7 = (uint)(byte)(bVar21 - 0x30) + iVar7 * 10;
              bVar21 = ((byte *)__s2._M_p)[1];
              __s2._M_p = __s2._M_p + 1;
            } while (0xf5 < (byte)(bVar21 - 0x3a));
          }
          iVar6 = -iVar7;
          if (bVar5 != 0x2d) {
            iVar6 = iVar7;
          }
        }
        else {
          iVar7 = strncasecmp("rate",__s2._M_p,4);
          if (((iVar7 == 0) && ((ulong)pbVar24[5] < 0x21)) &&
             ((0x100003601U >> ((ulong)pbVar24[5] & 0x3f) & 1) != 0)) {
            for (pbVar24 = pbVar24 + 6; (*pbVar24 == 0x20 || (*pbVar24 == 9)); pbVar24 = pbVar24 + 1
                ) {
            }
            __s2._M_p = fast_atoreal_move<float>((char *)pbVar24,(float *)local_110,true);
            (local_128._M_head_impl)->mTicksPerSecond = (double)(float)local_110._0_4_;
          }
          else {
            iVar7 = strncasecmp("order",__s2._M_p,5);
            if (((iVar7 == 0) && ((ulong)pbVar24[6] < 0x21)) &&
               ((0x100003601U >> ((ulong)pbVar24[6] & 0x3f) & 1) != 0)) {
              local_a8.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_a8.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_a8.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_11c = iVar6;
              std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::reserve(&local_a8,0x1e);
              __s2._M_p = (pointer)(pbVar24 + 7);
              do {
                for (; __src = local_a8.
                               super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                    _Var23._M_head_impl = local_128._M_head_impl, uVar25 = (ulong)(byte)*__s2._M_p,
                    0x20 < uVar25; __s2._M_p = __s2._M_p + lVar19) {
LAB_0043aaf8:
                  paVar12 = (aiNodeAnim *)operator_new(0x438);
                  (paVar12->mNodeName).length = 0;
                  (paVar12->mNodeName).data[0] = '\0';
                  memset((paVar12->mNodeName).data + 1,0x1b,0x3ff);
                  paVar12->mRotationKeys = (aiQuatKey *)0x0;
                  paVar12->mNumScalingKeys = 0;
                  *(undefined8 *)&paVar12->mNumPositionKeys = 0;
                  *(undefined8 *)((long)&paVar12->mPositionKeys + 4) = 0;
                  paVar12->mScalingKeys = (aiVectorKey *)0x0;
                  paVar12->mPreState = aiAnimBehaviour_DEFAULT;
                  paVar12->mPostState = aiAnimBehaviour_DEFAULT;
                  local_110._0_8_ = paVar12;
                  std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::emplace_back<aiNodeAnim*>
                            ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&local_a8,
                             (aiNodeAnim **)local_110);
                  paVar12 = local_a8.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1];
                  lVar19 = 0;
                  while( true ) {
                    bVar5 = ((byte *)__s2._M_p)[lVar19];
                    if (((ulong)bVar5 < 0x21) && ((0x100003601U >> ((ulong)bVar5 & 0x3f) & 1) != 0))
                    break;
                    (paVar12->mNodeName).data[lVar19] = bVar5;
                    lVar19 = lVar19 + 1;
                  }
                  (paVar12->mNodeName).data[lVar19] = '\0';
                  (paVar12->mNodeName).length = (ai_uint32)lVar19;
                }
                if ((0x3401UL >> (uVar25 & 0x3f) & 1) != 0) {
                  while ((byte)uVar25 < 0x25) {
                    if ((0x100002600U >> (uVar25 & 0x3f) & 1) == 0) {
                      if (uVar25 == 0x24) {
                        uVar8 = (uint)((ulong)((long)local_a8.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_a8.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
                        (local_128._M_head_impl)->mNumChannels = uVar8;
                        if (uVar8 == 0) {
                          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                          local_110._0_8_ = local_110 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_110,"CSM: Empty $order section","");
                          std::runtime_error::runtime_error(prVar16,(string *)local_110);
                          *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
                          __cxa_throw(prVar16,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        __dest_00 = (aiNodeAnim **)
                                    operator_new__((long)local_a8.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_a8.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0x7fffffff8);
                        (_Var23._M_head_impl)->mChannels = __dest_00;
                        memcpy(__dest_00,__src,(ulong)(_Var23._M_head_impl)->mNumChannels << 3);
                        iVar6 = local_11c;
                        if (__src != (pointer)0x0) {
                          operator_delete(__src,(long)local_a8.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                - (long)__src);
                          iVar6 = local_11c;
                        }
                        goto LAB_0043a440;
                      }
                      break;
                    }
                    pbVar24 = (byte *)__s2._M_p + 1;
                    __s2._M_p = __s2._M_p + 1;
                    uVar25 = (ulong)*pbVar24;
                  }
                  goto LAB_0043aaf8;
                }
                if ((0x100000200U >> (uVar25 & 0x3f) & 1) == 0) goto LAB_0043aaf8;
                __s2._M_p = __s2._M_p + 1;
              } while( true );
            }
            iVar7 = strncasecmp("points",__s2._M_p,6);
            _Var23._M_head_impl = local_128._M_head_impl;
            if (((iVar7 == 0) && ((ulong)pbVar24[7] < 0x21)) &&
               ((0x100003601U >> ((ulong)pbVar24[7] & 0x3f) & 1) != 0)) {
              if ((local_128._M_head_impl)->mNumChannels == 0) {
                prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_110._0_8_ = local_110 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_110,
                           "CSM: \'$order\' section is required to appear prior to \'$points\'","");
                std::runtime_error::runtime_error(prVar16,(string *)local_110);
                *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
                __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              local_118 = 100;
              if (iVar6 != 0xffffff) {
                local_118 = (ulong)(((uint)(iVar6 - (int)local_b0) >> 2) + (iVar6 - (int)local_b0));
                uVar25 = local_118 * 0x18;
                uVar22 = 0;
                local_11c = iVar6;
                do {
                  paVar11 = (aiVectorKey *)operator_new__(uVar25);
                  if ((int)local_118 != 0) {
                    uVar18 = 0;
                    do {
                      puVar2 = (undefined8 *)((long)&paVar11->mTime + uVar18);
                      *puVar2 = 0;
                      puVar2[1] = 0;
                      *(undefined4 *)((long)&(paVar11->mValue).z + uVar18) = 0;
                      uVar18 = uVar18 + 0x18;
                    } while (uVar25 != uVar18);
                  }
                  (_Var23._M_head_impl)->mChannels[uVar22]->mPositionKeys = paVar11;
                  uVar22 = uVar22 + 1;
                  iVar6 = local_11c;
                } while (uVar22 < (_Var23._M_head_impl)->mNumChannels);
              }
              __s2._M_p = (pointer)(pbVar24 + 8);
              local_bc = 0;
LAB_0043a5d9:
              do {
                uVar25 = (ulong)(byte)*__s2._M_p;
                if (uVar25 < 0x21) {
                  if ((0x100000200U >> (uVar25 & 0x3f) & 1) != 0) {
                    __s2._M_p = __s2._M_p + 1;
                    goto LAB_0043a5d9;
                  }
                  if ((0x3401UL >> (uVar25 & 0x3f) & 1) != 0) {
                    while ((byte)uVar25 < 0x25) {
                      if ((0x100002600U >> (uVar25 & 0x3f) & 1) == 0) {
                        if ((0x1000000001U >> (uVar25 & 0x3f) & 1) != 0) {
                          if ((ulong)(_Var23._M_head_impl)->mNumChannels != 0) {
                            uVar25 = 0;
                            do {
                              if ((_Var23._M_head_impl)->mChannels[uVar25]->mNumPositionKeys == 0) {
                                prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                                local_110._0_8_ = local_110 + 0x10;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_110,"CSM: Invalid marker track","");
                                std::runtime_error::runtime_error(prVar16,(string *)local_110);
                                *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
                                __cxa_throw(prVar16,&DeadlyImportError::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              uVar25 = uVar25 + 1;
                            } while ((_Var23._M_head_impl)->mNumChannels != uVar25);
                          }
                          goto LAB_0043a440;
                        }
                        break;
                      }
                      pbVar24 = (byte *)__s2._M_p + 1;
                      __s2._M_p = __s2._M_p + 1;
                      uVar25 = (ulong)*pbVar24;
                    }
                  }
                }
                bVar5 = (byte)uVar25;
                local_b0 = 0;
                while (iVar7 = (int)local_b0, 0xf5 < (byte)(bVar5 - 0x3a)) {
                  local_b0 = (ulong)((uint)(byte)((char)uVar25 - 0x30) + iVar7 * 10);
                  bVar5 = ((byte *)__s2._M_p)[1];
                  uVar25 = (ulong)bVar5;
                  __s2._M_p = __s2._M_p + 1;
                }
                local_11c = iVar6;
                if (iVar6 < iVar7) {
                  local_11c = iVar7;
                }
                if ((_Var23._M_head_impl)->mNumChannels != 0) {
                  local_48 = (ulong)(uint)((int)local_118 * 2);
                  uVar25 = local_48 * 0x18;
                  local_50 = (local_118 & 0xffffffff) * 0x18;
                  local_40 = (double)iVar7;
                  paVar12 = (aiNodeAnim *)0x0;
                  do {
                    paVar20 = (_Var23._M_head_impl)->mChannels[(long)paVar12];
                    if (paVar20->mNumPositionKeys == (uint)local_118) {
                      paVar11 = paVar20->mPositionKeys;
                      uVar8 = (uint)local_48;
                      paVar20->mNumPositionKeys = uVar8;
                      local_b8 = paVar12;
                      __dest = (aiVectorKey *)operator_new__(uVar25);
                      if (uVar8 != 0) {
                        uVar22 = 0;
                        do {
                          puVar2 = (undefined8 *)((long)&__dest->mTime + uVar22);
                          *puVar2 = 0;
                          puVar2[1] = 0;
                          *(undefined4 *)((long)&(__dest->mValue).z + uVar22) = 0;
                          uVar22 = uVar22 + 0x18;
                        } while (uVar25 != uVar22);
                      }
                      paVar20->mPositionKeys = __dest;
                      memcpy(__dest,paVar11,local_50);
                      paVar12 = local_b8;
                      if (paVar11 != (aiVectorKey *)0x0) {
                        operator_delete__(paVar11);
                        paVar12 = local_b8;
                      }
                    }
                    for (; uVar22 = (ulong)(byte)*__s2._M_p, uVar22 < 0x21;
                        __s2._M_p = __s2._M_p + 1) {
                      if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                        if (uVar22 == 0) {
                          prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                          local_110._0_8_ = local_110 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_110,
                                     "CSM: Unexpected EOF occurred reading sample x coord","");
                          std::runtime_error::runtime_error(prVar16,(string *)local_110);
                          *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
                          __cxa_throw(prVar16,&DeadlyImportError::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        break;
                      }
                    }
                    iVar6 = strncasecmp("DROPOUT",__s2._M_p,7);
                    if (((iVar6 == 0) && ((ulong)((byte *)__s2._M_p)[7] < 0x21)) &&
                       ((0x100003601U >> ((ulong)((byte *)__s2._M_p)[7] & 0x3f) & 1) != 0)) {
                      this_00 = DefaultLogger::get();
                      Logger::warn(this_00,"CSM: Encountered invalid marker data (DROPOUT)");
                      __s2._M_p = __s2._M_p + 8;
                    }
                    else {
                      paVar11 = paVar20->mPositionKeys;
                      uVar8 = paVar20->mNumPositionKeys;
                      paVar11[uVar8].mTime = local_40;
                      local_b8 = paVar20;
                      for (pbVar24 = (byte *)fast_atoreal_move<float>
                                                       (__s2._M_p,&paVar11[uVar8].mValue.x,true);
                          uVar22 = (ulong)*pbVar24, uVar22 < 0x21; pbVar24 = pbVar24 + 1) {
                        if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                          if (uVar22 == 0) {
                            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                            local_110._0_8_ = local_110 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_110,
                                       "CSM: Unexpected EOF occurred reading sample y coord","");
                            std::runtime_error::runtime_error(prVar16,(string *)local_110);
                            *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
                            __cxa_throw(prVar16,&DeadlyImportError::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          break;
                        }
                      }
                      for (pbVar24 = (byte *)fast_atoreal_move<float>
                                                       ((char *)pbVar24,&paVar11[uVar8].mValue.y,
                                                        true); uVar22 = (ulong)*pbVar24,
                          uVar22 < 0x21; pbVar24 = pbVar24 + 1) {
                        if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                          if (uVar22 == 0) {
                            prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                            local_110._0_8_ = local_110 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_110,
                                       "CSM: Unexpected EOF occurred reading sample z coord","");
                            std::runtime_error::runtime_error(prVar16,(string *)local_110);
                            *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
                            __cxa_throw(prVar16,&DeadlyImportError::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          break;
                        }
                      }
                      __s2._M_p = fast_atoreal_move<float>
                                            ((char *)pbVar24,&paVar11[uVar8].mValue.z,true);
                      local_b8->mNumPositionKeys = local_b8->mNumPositionKeys + 1;
                    }
                    paVar12 = (aiNodeAnim *)((long)&(paVar12->mNodeName).length + 1);
                    _Var23._M_head_impl = local_128._M_head_impl;
                  } while (paVar12 < (aiNodeAnim *)(ulong)(local_128._M_head_impl)->mNumChannels);
                }
                local_118 = (ulong)(uint)((int)local_118 << (local_bc == (int)local_118));
                local_bc = local_bc + 1;
                iVar6 = local_11c;
              } while( true );
            }
          }
        }
      }
    }
    else {
LAB_0043a8aa:
      while ((0xd < bVar5 || ((0x2401U >> (bVar5 & 0x1f) & 1) == 0))) {
        bVar5 = pbVar24[1];
        pbVar24 = pbVar24 + 1;
      }
      while ((bVar5 == 0xd || (__s2._M_p = (pointer)pbVar24, bVar5 == 10))) {
        pbVar1 = pbVar24 + 1;
        pbVar24 = pbVar24 + 1;
        bVar5 = *pbVar1;
      }
    }
  } while( true );
}

Assistant:

void CSMImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open CSM file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    std::unique_ptr<aiAnimation> anim(new aiAnimation());
    int first = 0, last = 0x00ffffff;

    // now process the file and look out for '$' sections
    while (1)   {
        SkipSpaces(&buffer);
        if ('\0' == *buffer)
            break;

        if ('$'  == *buffer)    {
            ++buffer;
            if (TokenMatchI(buffer,"firstframe",10))    {
                SkipSpaces(&buffer);
                first = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"lastframe",9))     {
                SkipSpaces(&buffer);
                last = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"rate",4))  {
                SkipSpaces(&buffer);
                float d;
                buffer = fast_atoreal_move<float>(buffer,d);
                anim->mTicksPerSecond = d;
            }
            else if (TokenMatchI(buffer,"order",5)) {
                std::vector< aiNodeAnim* > anims_temp;
                anims_temp.reserve(30);
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && SkipSpacesAndLineEnd(&buffer) && *buffer == '$')
                        break; // next section

                    // Construct a new node animation channel and setup its name
                    anims_temp.push_back(new aiNodeAnim());
                    aiNodeAnim* nda = anims_temp.back();

                    char* ot = nda->mNodeName.data;
                    while (!IsSpaceOrNewLine(*buffer))
                        *ot++ = *buffer++;

                    *ot = '\0';
                    nda->mNodeName.length = (size_t)(ot-nda->mNodeName.data);
                }

                anim->mNumChannels = static_cast<unsigned int>(anims_temp.size());
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: Empty $order section");

                // copy over to the output animation
                anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
                ::memcpy(anim->mChannels,&anims_temp[0],sizeof(aiNodeAnim*)*anim->mNumChannels);
            }
            else if (TokenMatchI(buffer,"points",6))    {
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: \'$order\' section is required to appear prior to \'$points\'");

                // If we know how many frames we'll read, we can preallocate some storage
                unsigned int alloc = 100;
                if (last != 0x00ffffff)
                {
                    alloc = last-first;
                    alloc += alloc>>2u; // + 25%
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)
                        anim->mChannels[i]->mPositionKeys = new aiVectorKey[alloc];
                }

                unsigned int filled = 0;

                // Now read all point data.
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && (!SkipSpacesAndLineEnd(&buffer) || *buffer == '$'))   {
                        break; // next section
                    }

                    // read frame
                    const int frame = ::strtoul10(buffer,&buffer);
                    last  = std::max(frame,last);
                    first = std::min(frame,last);
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                        aiNodeAnim* s = anim->mChannels[i];
                        if (s->mNumPositionKeys == alloc)   { /* need to reallocate? */

                            aiVectorKey* old = s->mPositionKeys;
                            s->mPositionKeys = new aiVectorKey[s->mNumPositionKeys = alloc*2];
                            ::memcpy(s->mPositionKeys,old,sizeof(aiVectorKey)*alloc);
                            delete[] old;
                        }

                        // read x,y,z
                        if(!SkipSpacesAndLineEnd(&buffer))
                            throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample x coord");

                        if (TokenMatchI(buffer, "DROPOUT", 7))  {
                            // seems this is invalid marker data; at least the doc says it's possible
                            ASSIMP_LOG_WARN("CSM: Encountered invalid marker data (DROPOUT)");
                        }
                        else    {
                            aiVectorKey* sub = s->mPositionKeys + s->mNumPositionKeys;
                            sub->mTime = (double)frame;
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.x);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample y coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.y);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample z coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.z);

                            ++s->mNumPositionKeys;
                        }
                    }

                    // update allocation granularity
                    if (filled == alloc)
                        alloc *= 2;

                    ++filled;
                }
                // all channels must be complete in order to continue safely.
                for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                    if (!anim->mChannels[i]->mNumPositionKeys)
                        throw DeadlyImportError("CSM: Invalid marker track");
                }
            }
        }
        else    {
            // advance to the next line
            SkipLine(&buffer);
        }
    }

    // Setup a proper animation duration
    anim->mDuration = last - std::min( first, 0 );

    // build a dummy root node with the tiny markers as children
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("$CSM_DummyRoot");

    pScene->mRootNode->mNumChildren = anim->mNumChannels;
    pScene->mRootNode->mChildren = new aiNode* [anim->mNumChannels];

    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* na = anim->mChannels[i];

        aiNode* nd  = pScene->mRootNode->mChildren[i] = new aiNode();
        nd->mName   = anim->mChannels[i]->mNodeName;
        nd->mParent = pScene->mRootNode;

        aiMatrix4x4::Translation(na->mPositionKeys[0].mValue, nd->mTransformation);
    }

    // Store the one and only animation in the scene
    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations=1];
    anim->mName.Set("$CSM_MasterAnim");
    pScene->mAnimations[0] = anim.release();

    // mark the scene as incomplete and run SkeletonMeshBuilder on it
    pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

    if (!noSkeletonMesh) {
        SkeletonMeshBuilder maker(pScene,pScene->mRootNode,true);
    }
}